

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall
ADPlanner::UpdatePredsofUnderconsState
          (ADPlanner *this,ADState *state,ADSearchStateSpace_t *pSearchStateSpace)

{
  DiscreteSpaceInformation *pDVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  int pind;
  long lVar4;
  vector<int,_std::allocator<int>_> PredIDV;
  vector<int,_std::allocator<int>_> CostV;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1 = (this->super_SBPLPlanner).environment_;
  (*pDVar1->_vptr_DiscreteSpaceInformation[0xb])(pDVar1,(ulong)**(uint **)(state + 0x18));
  lVar4 = 0;
  while( true ) {
    if ((int)((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_68._M_impl.super__Vector_impl_data._M_start) >> 2) <= lVar4) break;
    iVar3 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x19])
                      (this,(ulong)(uint)local_68._M_impl.super__Vector_impl_data._M_start[lVar4],
                       pSearchStateSpace);
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x38);
    if (*(unsigned_short *)(lVar2 + 0x2a) != pSearchStateSpace->callnumber) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1c])(this,lVar2,pSearchStateSpace);
    }
    if (*(long *)(lVar2 + 0x38) == *(long *)(state + 0x18)) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x23])(this,lVar2);
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x22])(this,lVar2);
    }
    lVar4 = lVar4 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void ADPlanner::UpdatePredsofUnderconsState(ADState* state, ADSearchStateSpace_t* pSearchStateSpace)
{
    vector<int> PredIDV;
    vector<int> CostV;
    CKey key;
    ADState *predstate;

    environment_->GetPreds(state->MDPstate->StateID, &PredIDV, &CostV);

    //iterate through predecessors of s
    for (int pind = 0; pind < (int)PredIDV.size(); pind++) {

        CMDPSTATE* PredMDPState = GetState(PredIDV[pind], pSearchStateSpace);
        predstate = (ADState*)(PredMDPState->PlannerSpecificData);
        if (predstate->callnumberaccessed != pSearchStateSpace->callnumber) {
            ReInitializeSearchStateInfo(predstate, pSearchStateSpace);
        }

        if (predstate->bestnextstate == state->MDPstate) {
            Recomputegval(predstate);
            UpdateSetMembership(predstate);

#if DEBUG
            if(predstate->MDPstate->StateID == 679256)
            {
                SBPL_FPRINTF(fDeb, "updated pred %d of undercons exp\n", predstate->MDPstate->StateID);
                PrintSearchState(predstate, fDeb);
                SBPL_FPRINTF(fDeb, "\n");
            }
#endif
        }
    } //for predecessors
}